

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

int QuantizeBlock_SSE2(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  unkbyte10 Var17;
  unkbyte10 Var18;
  int iVar19;
  int iVar20;
  short sVar21;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  undefined1 auVar22 [16];
  short sVar30;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 auVar31 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  short sVar51;
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  short sVar58;
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar48 [12];
  undefined1 auVar50 [16];
  undefined1 auVar55 [12];
  undefined1 auVar57 [16];
  
  auVar22 = *(undefined1 (*) [16])in;
  auVar31 = *(undefined1 (*) [16])(in + 8);
  auVar40 = *(undefined1 (*) [16])mtx->iq_;
  auVar44 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar21 = auVar22._0_2_;
  sVar51 = -sVar21;
  sVar23 = auVar22._2_2_;
  sVar58 = -sVar23;
  sVar24 = auVar22._4_2_;
  sVar1 = -sVar24;
  sVar25 = auVar22._6_2_;
  sVar2 = -sVar25;
  sVar26 = auVar22._8_2_;
  sVar3 = -sVar26;
  sVar27 = auVar22._10_2_;
  sVar4 = -sVar27;
  sVar28 = auVar22._12_2_;
  sVar5 = -sVar28;
  sVar29 = auVar22._14_2_;
  sVar6 = -sVar29;
  auVar22 = psraw(auVar22,0xf);
  sVar30 = auVar31._0_2_;
  sVar7 = -sVar30;
  sVar32 = auVar31._2_2_;
  sVar8 = -sVar32;
  sVar33 = auVar31._4_2_;
  sVar9 = -sVar33;
  sVar34 = auVar31._6_2_;
  sVar10 = -sVar34;
  sVar35 = auVar31._8_2_;
  sVar11 = -sVar35;
  sVar36 = auVar31._10_2_;
  sVar12 = -sVar36;
  sVar37 = auVar31._12_2_;
  sVar13 = -sVar37;
  sVar38 = auVar31._14_2_;
  sVar14 = -sVar38;
  auVar31 = psraw(auVar31,0xf);
  auVar56._0_2_ =
       mtx->sharpen_[0] + ((ushort)(sVar51 < sVar21) * sVar21 | (ushort)(sVar51 >= sVar21) * sVar51)
  ;
  auVar56._2_2_ =
       mtx->sharpen_[1] + ((ushort)(sVar58 < sVar23) * sVar23 | (ushort)(sVar58 >= sVar23) * sVar58)
  ;
  auVar56._4_2_ =
       mtx->sharpen_[2] + ((ushort)(sVar1 < sVar24) * sVar24 | (ushort)(sVar1 >= sVar24) * sVar1);
  auVar56._6_2_ =
       mtx->sharpen_[3] + ((ushort)(sVar2 < sVar25) * sVar25 | (ushort)(sVar2 >= sVar25) * sVar2);
  auVar56._8_2_ =
       mtx->sharpen_[4] + ((ushort)(sVar3 < sVar26) * sVar26 | (ushort)(sVar3 >= sVar26) * sVar3);
  auVar56._10_2_ =
       mtx->sharpen_[5] + ((ushort)(sVar4 < sVar27) * sVar27 | (ushort)(sVar4 >= sVar27) * sVar4);
  auVar56._12_2_ =
       mtx->sharpen_[6] + ((ushort)(sVar5 < sVar28) * sVar28 | (ushort)(sVar5 >= sVar28) * sVar5);
  auVar56._14_2_ =
       mtx->sharpen_[7] + ((ushort)(sVar6 < sVar29) * sVar29 | (ushort)(sVar6 >= sVar29) * sVar6);
  auVar49._0_2_ =
       mtx->sharpen_[8] + ((ushort)(sVar7 < sVar30) * sVar30 | (ushort)(sVar7 >= sVar30) * sVar7);
  auVar49._2_2_ =
       mtx->sharpen_[9] + ((ushort)(sVar8 < sVar32) * sVar32 | (ushort)(sVar8 >= sVar32) * sVar8);
  auVar49._4_2_ =
       mtx->sharpen_[10] + ((ushort)(sVar9 < sVar33) * sVar33 | (ushort)(sVar9 >= sVar33) * sVar9);
  auVar49._6_2_ =
       mtx->sharpen_[0xb] +
       ((ushort)(sVar10 < sVar34) * sVar34 | (ushort)(sVar10 >= sVar34) * sVar10);
  auVar49._8_2_ =
       mtx->sharpen_[0xc] +
       ((ushort)(sVar11 < sVar35) * sVar35 | (ushort)(sVar11 >= sVar35) * sVar11);
  auVar49._10_2_ =
       mtx->sharpen_[0xd] +
       ((ushort)(sVar12 < sVar36) * sVar36 | (ushort)(sVar12 >= sVar36) * sVar12);
  auVar49._12_2_ =
       mtx->sharpen_[0xe] +
       ((ushort)(sVar13 < sVar37) * sVar37 | (ushort)(sVar13 >= sVar37) * sVar13);
  auVar49._14_2_ =
       mtx->sharpen_[0xf] +
       ((ushort)(sVar14 < sVar38) * sVar38 | (ushort)(sVar14 >= sVar38) * sVar14);
  auVar52 = pmulhuw(auVar56,auVar40);
  sVar58 = auVar56._6_2_ * auVar40._6_2_;
  auVar39 = pmulhuw(auVar49,auVar44);
  sVar51 = auVar49._6_2_ * auVar44._6_2_;
  iVar19 = CONCAT22(auVar52._6_2_,sVar58);
  Var17 = CONCAT64(CONCAT42(iVar19,auVar52._4_2_),CONCAT22(auVar56._4_2_ * auVar40._4_2_,sVar58));
  auVar15._4_8_ = (long)((unkuint10)Var17 >> 0x10);
  auVar15._2_2_ = auVar52._2_2_;
  auVar15._0_2_ = auVar56._2_2_ * auVar40._2_2_;
  iVar54 = CONCAT22(auVar52._8_2_,auVar56._8_2_ * auVar40._8_2_);
  auVar55._0_8_ = CONCAT26(auVar52._10_2_,CONCAT24(auVar56._10_2_ * auVar40._10_2_,iVar54));
  auVar55._8_2_ = auVar56._12_2_ * auVar40._12_2_;
  auVar55._10_2_ = auVar52._12_2_;
  auVar57._12_2_ = auVar56._14_2_ * auVar40._14_2_;
  auVar57._0_12_ = auVar55;
  auVar57._14_2_ = auVar52._14_2_;
  iVar20 = CONCAT22(auVar39._6_2_,sVar51);
  Var18 = CONCAT64(CONCAT42(iVar20,auVar39._4_2_),CONCAT22(auVar49._4_2_ * auVar44._4_2_,sVar51));
  auVar16._4_8_ = (long)((unkuint10)Var18 >> 0x10);
  auVar16._2_2_ = auVar39._2_2_;
  auVar16._0_2_ = auVar49._2_2_ * auVar44._2_2_;
  iVar47 = CONCAT22(auVar39._8_2_,auVar49._8_2_ * auVar44._8_2_);
  auVar48._0_8_ = CONCAT26(auVar39._10_2_,CONCAT24(auVar49._10_2_ * auVar44._10_2_,iVar47));
  auVar48._8_2_ = auVar49._12_2_ * auVar44._12_2_;
  auVar48._10_2_ = auVar39._12_2_;
  auVar50._12_2_ = auVar49._14_2_ * auVar44._14_2_;
  auVar50._0_12_ = auVar48;
  auVar50._14_2_ = auVar39._14_2_;
  auVar52._0_4_ =
       (int)(mtx->bias_[0] + CONCAT22(auVar52._0_2_,auVar56._0_2_ * auVar40._0_2_)) >> 0x11;
  auVar52._4_4_ = (int)(mtx->bias_[1] + auVar15._0_4_) >> 0x11;
  auVar52._8_4_ = (int)(mtx->bias_[2] + (int)((unkuint10)Var17 >> 0x10)) >> 0x11;
  auVar52._12_4_ = (int)(mtx->bias_[3] + iVar19) >> 0x11;
  auVar59._0_4_ = (int)(mtx->bias_[4] + iVar54) >> 0x11;
  auVar59._4_4_ = (int)(mtx->bias_[5] + (int)((ulong)auVar55._0_8_ >> 0x20)) >> 0x11;
  auVar59._8_4_ = (int)(mtx->bias_[6] + auVar55._8_4_) >> 0x11;
  auVar59._12_4_ = (int)(mtx->bias_[7] + auVar57._12_4_) >> 0x11;
  auVar40 = packssdw(auVar52,auVar59);
  auVar43._0_4_ =
       (int)(mtx->bias_[8] + CONCAT22(auVar39._0_2_,auVar49._0_2_ * auVar44._0_2_)) >> 0x11;
  auVar43._4_4_ = (int)(mtx->bias_[9] + auVar16._0_4_) >> 0x11;
  auVar43._8_4_ = (int)(mtx->bias_[10] + (int)((unkuint10)Var18 >> 0x10)) >> 0x11;
  auVar43._12_4_ = (int)(mtx->bias_[0xb] + iVar20) >> 0x11;
  auVar53._0_4_ = (int)(mtx->bias_[0xc] + iVar47) >> 0x11;
  auVar53._4_4_ = (int)(mtx->bias_[0xd] + (int)((ulong)auVar48._0_8_ >> 0x20)) >> 0x11;
  auVar53._8_4_ = (int)(mtx->bias_[0xe] + auVar48._8_4_) >> 0x11;
  auVar53._12_4_ = (int)(mtx->bias_[0xf] + auVar50._12_4_) >> 0x11;
  auVar44 = packssdw(auVar43,auVar53);
  sVar51 = auVar40._0_2_;
  auVar41._0_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar40._2_2_;
  auVar41._2_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar40._4_2_;
  auVar41._4_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar40._6_2_;
  auVar41._6_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar40._8_2_;
  auVar41._8_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar40._10_2_;
  auVar41._10_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar40._12_2_;
  sVar58 = auVar40._14_2_;
  auVar41._12_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  auVar41._14_2_ = (ushort)(0x7ff < sVar58) * 0x7ff | (ushort)(0x7ff >= sVar58) * sVar58;
  sVar51 = auVar44._0_2_;
  auVar45._0_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar44._2_2_;
  auVar45._2_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar44._4_2_;
  auVar45._4_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar44._6_2_;
  auVar45._6_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar44._8_2_;
  auVar45._8_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar44._10_2_;
  auVar45._10_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  sVar51 = auVar44._12_2_;
  sVar58 = auVar44._14_2_;
  auVar45._12_2_ = (ushort)(0x7ff < sVar51) * 0x7ff | (ushort)(0x7ff >= sVar51) * sVar51;
  auVar45._14_2_ = (ushort)(0x7ff < sVar58) * 0x7ff | (ushort)(0x7ff >= sVar58) * sVar58;
  auVar41 = auVar41 ^ auVar22;
  auVar45 = auVar45 ^ auVar31;
  auVar42._0_2_ = auVar41._0_2_ - auVar22._0_2_;
  auVar42._2_2_ = auVar41._2_2_ - auVar22._2_2_;
  auVar42._4_2_ = auVar41._4_2_ - auVar22._4_2_;
  auVar42._6_2_ = auVar41._6_2_ - auVar22._6_2_;
  auVar42._8_2_ = auVar41._8_2_ - auVar22._8_2_;
  auVar42._10_2_ = auVar41._10_2_ - auVar22._10_2_;
  auVar42._12_2_ = auVar41._12_2_ - auVar22._12_2_;
  auVar42._14_2_ = auVar41._14_2_ - auVar22._14_2_;
  auVar46._0_2_ = auVar45._0_2_ - auVar31._0_2_;
  auVar46._2_2_ = auVar45._2_2_ - auVar31._2_2_;
  auVar46._4_2_ = auVar45._4_2_ - auVar31._4_2_;
  auVar46._6_2_ = auVar45._6_2_ - auVar31._6_2_;
  auVar46._8_2_ = auVar45._8_2_ - auVar31._8_2_;
  auVar46._10_2_ = auVar45._10_2_ - auVar31._10_2_;
  auVar46._12_2_ = auVar45._12_2_ - auVar31._12_2_;
  auVar46._14_2_ = auVar45._14_2_ - auVar31._14_2_;
  auVar22._0_2_ = mtx->q_[0] * auVar42._0_2_;
  auVar22._2_2_ = mtx->q_[1] * auVar42._2_2_;
  auVar22._4_2_ = mtx->q_[2] * auVar42._4_2_;
  auVar22._6_2_ = mtx->q_[3] * auVar42._6_2_;
  auVar22._8_2_ = mtx->q_[4] * auVar42._8_2_;
  auVar22._10_2_ = mtx->q_[5] * auVar42._10_2_;
  auVar22._12_2_ = mtx->q_[6] * auVar42._12_2_;
  auVar22._14_2_ = mtx->q_[7] * auVar42._14_2_;
  auVar44._0_2_ = mtx->q_[8] * auVar46._0_2_;
  auVar44._2_2_ = mtx->q_[9] * auVar46._2_2_;
  auVar44._4_2_ = mtx->q_[10] * auVar46._4_2_;
  auVar44._6_2_ = mtx->q_[0xb] * auVar46._6_2_;
  auVar44._8_2_ = mtx->q_[0xc] * auVar46._8_2_;
  auVar44._10_2_ = mtx->q_[0xd] * auVar46._10_2_;
  auVar44._12_2_ = mtx->q_[0xe] * auVar46._12_2_;
  auVar44._14_2_ = mtx->q_[0xf] * auVar46._14_2_;
  *(undefined1 (*) [16])in = auVar22;
  *(undefined1 (*) [16])(in + 8) = auVar44;
  auVar22 = pshufhw(auVar22,auVar42,0xc6);
  auVar31._0_4_ = auVar22._0_4_;
  auVar31._8_4_ = auVar22._8_4_;
  auVar31._4_4_ = auVar22._12_4_;
  auVar31._12_4_ = auVar22._4_4_;
  auVar22 = pshufhw(auVar31,auVar31,0x39);
  auVar31 = pshuflw(auVar44,auVar46,0xc6);
  auVar39._0_4_ = auVar31._0_4_;
  auVar39._12_4_ = auVar31._12_4_;
  auVar39._4_4_ = auVar31._8_4_;
  auVar39._8_4_ = auVar31._4_4_;
  auVar31 = pshuflw(auVar39,auVar39,0x39);
  *(undefined1 (*) [16])out = auVar22;
  *(undefined1 (*) [16])(out + 8) = auVar31;
  auVar22 = packsswb(auVar22,auVar31);
  out[3] = auVar46._0_2_;
  out[0xc] = auVar42._14_2_;
  auVar40[0] = -(auVar22[0] == '\0');
  auVar40[1] = -(auVar22[1] == '\0');
  auVar40[2] = -(auVar22[2] == '\0');
  auVar40[3] = -(auVar22[3] == '\0');
  auVar40[4] = -(auVar22[4] == '\0');
  auVar40[5] = -(auVar22[5] == '\0');
  auVar40[6] = -(auVar22[6] == '\0');
  auVar40[7] = -(auVar22[7] == '\0');
  auVar40[8] = -(auVar22[8] == '\0');
  auVar40[9] = -(auVar22[9] == '\0');
  auVar40[10] = -(auVar22[10] == '\0');
  auVar40[0xb] = -(auVar22[0xb] == '\0');
  auVar40[0xc] = -(auVar22[0xc] == '\0');
  auVar40[0xd] = -(auVar22[0xd] == '\0');
  auVar40[0xe] = -(auVar22[0xe] == '\0');
  auVar40[0xf] = -(auVar22[0xf] == '\0');
  return (uint)((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar40[0xf] >> 7) << 0xf) != 0xffff);
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(int16_t in[16], int16_t out[16],
                                            const uint16_t* const sharpen,
                                            const VP8Matrix* const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}